

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3_result_error_code(sqlite3_context *pCtx,int errCode)

{
  char *z;
  
  pCtx->isError = errCode;
  if (((pCtx->s).flags & 1) == 0) {
    return;
  }
  z = sqlite3ErrStr(errCode);
  sqlite3VdbeMemSetStr(&pCtx->s,z,-1,'\x01',(_func_void_void_ptr *)0x0);
  return;
}

Assistant:

SQLITE_API void sqlite3_result_error_code(sqlite3_context *pCtx, int errCode){
  pCtx->isError = errCode;
  if( pCtx->s.flags & MEM_Null ){
    sqlite3VdbeMemSetStr(&pCtx->s, sqlite3ErrStr(errCode), -1, 
                         SQLITE_UTF8, SQLITE_STATIC);
  }
}